

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptNumber::ToLocaleStringIntl
          (ArgumentReader *args,CallInfo callInfo,ScriptContext *scriptContext)

{
  EngineInterfaceObject *this;
  ScriptContext *pSVar1;
  code *pcVar2;
  Var this_00;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  EngineExtensionObjectBase *pEVar7;
  Var pvVar8;
  JavascriptString *pJVar9;
  RecyclableObject *pRVar10;
  JavascriptString *unaff_RBX;
  ThreadContext *pTVar11;
  Type TVar12;
  Arguments local_80;
  Arguments local_70;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  double value;
  Var result;
  ScriptContext *local_38;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x305,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00cebdf5;
    *puVar6 = 0;
  }
  if ((DAT_015b01f0 == '\x01') && (bVar3 = ScriptContext::IsIntlEnabled(scriptContext), bVar3)) {
    this = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).engineInterfaceObject.ptr;
    bVar3 = true;
    if (this != (EngineInterfaceObject *)0x0) {
      pEVar7 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
      pSVar1 = pEVar7[1].scriptContext.ptr;
      if (pSVar1 == (ScriptContext *)0x0) {
        JavascriptLibrary::InitializeIntlForNumberPrototype
                  ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        pSVar1 = pEVar7[1].scriptContext.ptr;
        if (pSVar1 == (ScriptContext *)0x0) goto LAB_00cebb59;
        pTVar11 = scriptContext->threadContext;
        bVar3 = pTVar11->reentrancySafeOrHandled;
        pTVar11->reentrancySafeOrHandled = true;
        local_70.Info = (args->super_Arguments).Info;
        local_70.Values = (args->super_Arguments).Values;
        pvVar8 = JavascriptFunction::CallFunction((JavascriptFunction *)pSVar1,&local_70);
        unaff_RBX = VarTo<Js::JavascriptString>(pvVar8);
      }
      else {
        pTVar11 = scriptContext->threadContext;
        bVar3 = pTVar11->reentrancySafeOrHandled;
        pTVar11->reentrancySafeOrHandled = true;
        local_80.Info = (args->super_Arguments).Info;
        local_80.Values = (args->super_Arguments).Values;
        pvVar8 = JavascriptFunction::CallFunction((JavascriptFunction *)pSVar1,&local_80);
        unaff_RBX = VarTo<Js::JavascriptString>(pvVar8);
      }
      pTVar11->reentrancySafeOrHandled = bVar3;
      bVar3 = false;
    }
LAB_00cebb59:
    if (!bVar3) {
      return unaff_RBX;
    }
  }
  pvVar8 = Arguments::operator[](&args->super_Arguments,0);
  BVar4 = GetThisValue(pvVar8,&local_50);
  if (BVar4 != 0) {
    pJVar9 = ToLocaleString(local_50,scriptContext);
    return pJVar9;
  }
  local_38 = scriptContext;
  pvVar8 = Arguments::operator[](&args->super_Arguments,0);
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00cebdf5;
    *puVar6 = 0;
  }
  result = args;
  if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00cebdf5;
    *puVar6 = 0;
  }
  this_00 = result;
  TVar12 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar12 = TypeIds_Number, (ulong)pvVar8 >> 0x32 == 0)) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cebdf5;
      *puVar6 = 0;
    }
    TVar12 = ((pRVar10->type).ptr)->typeId;
    if ((0x57 < (int)TVar12) && (BVar4 = RecyclableObject::IsExternal(pRVar10), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00cebdf5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  if (TVar12 == TypeIds_HostDispatch) {
    pvVar8 = Arguments::operator[]((Arguments *)this_00,0);
    pRVar10 = VarTo<Js::RecyclableObject>(pvVar8);
    local_60 = *this_00;
    local_58 = *(undefined8 *)((long)this_00 + 8);
    iVar5 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])(pRVar10,EntryToLocaleString,&local_60,&value);
    if (iVar5 != 0) {
      pJVar9 = VarTo<Js::JavascriptString>((Var)value);
      return pJVar9;
    }
  }
  JavascriptError::ThrowTypeError(local_38,-0x7ff5ec3c,L"Number.prototype.toLocaleString");
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringIntl(ArgumentReader& args, CallInfo callInfo, ScriptContext* scriptContext)
    {
       Assert(scriptContext);
#ifdef ENABLE_INTL_OBJECT
        if(CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
                // Initialize Number.prototype.toLocaleString
                scriptContext->GetLibrary()->InitializeIntlForNumberPrototype();
                func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToLocaleString, args, &result))
                {
                    return VarTo<JavascriptString>(result);
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toLocaleString"));
        }

        return JavascriptNumber::ToLocaleString(value, scriptContext);
    }